

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O2

void __thiscall SPTest_VarStages_Test::TestBody(SPTest_VarStages_Test *this)

{
  SuffixHandler<int> SVar1;
  char *pcVar2;
  int i;
  long lVar3;
  StringRef name;
  AssertHelper local_648;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_640;
  AssertionResult gtest_ar;
  SPAdapter sp;
  TestBasicProblem p;
  
  TestBasicProblem::TestBasicProblem(&p,6,0);
  name.size_ = 5;
  name.data_ = "stage";
  SVar1 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<int>
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)&p,name,0);
  **(undefined4 **)((long)SVar1.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) = 3;
  *(undefined4 *)
   (*(long *)((long)SVar1.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) + 4) = 2;
  *(undefined4 *)
   (*(long *)((long)SVar1.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) + 8) = 3;
  mp::SPAdapter::SPAdapter(&sp,(ColProblem *)&p);
  local_640.ptr_._0_4_ = 6;
  local_648.data_._0_4_ =
       (int)((ulong)((long)sp.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)sp.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"6","sp.num_vars()",(int *)&local_640,(int *)&local_648);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_640);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x148,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,(Message *)&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_640);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_640.ptr_._0_4_ = 0;
  local_648.data_._0_4_ =
       (int)(((long)((sp.problem_)->super_Problem).algebraic_cons_.
                    super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)((sp.problem_)->super_Problem).algebraic_cons_.
                   super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x88);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","sp.num_cons()",(int *)&local_640,(int *)&local_648);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_640);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x149,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,(Message *)&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_640);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_640.ptr_._0_4_ = 3;
  local_648.data_._0_4_ = sp.num_stages_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"3","sp.num_stages()",(int *)&local_640,(int *)&local_648);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_640);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14a,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,(Message *)&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_640);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_640.ptr_._0_4_ = 3;
  local_648.data_._0_4_ =
       *sp.num_stage_vars_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"3","sp.stage(0).num_vars()",(int *)&local_640,(int *)&local_648)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_640);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14b,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,(Message *)&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_640);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_640.ptr_._0_4_ = 1;
  local_648.data_._0_4_ =
       sp.num_stage_vars_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","sp.stage(1).num_vars()",(int *)&local_640,(int *)&local_648)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_640);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14c,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,(Message *)&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_640);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_640.ptr_._0_4_ = 2;
  local_648.data_._0_4_ =
       sp.num_stage_vars_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"2","sp.stage(2).num_vars()",(int *)&local_640,(int *)&local_648)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_640);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14d,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,(Message *)&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_640);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    local_640.ptr_._0_4_ = 0;
    local_648.data_._0_4_ =
         sp.num_stage_cons_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3];
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0","sp.stage(i).num_cons()",(int *)&local_640,
               (int *)&local_648);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_640);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_648,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14f
                 ,pcVar2);
      testing::internal::AssertHelper::operator=(&local_648,(Message *)&local_640);
      testing::internal::AssertHelper::~AssertHelper(&local_648);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_640);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  mp::SPAdapter::~SPAdapter(&sp);
  mp::ColProblem::~ColProblem((ColProblem *)&p);
  return;
}

Assistant:

TEST(SPTest, VarStages) {
  TestBasicProblem p(6);
  auto stage = p.AddIntSuffix("stage", mp::suf::VAR, 3);
  stage.SetValue(0, 3);
  stage.SetValue(1, 2);
  stage.SetValue(2, 3);
  mp::SPAdapter sp(p);
  EXPECT_EQ(6, sp.num_vars());
  EXPECT_EQ(0, sp.num_cons());
  EXPECT_EQ(3, sp.num_stages());
  EXPECT_EQ(3, sp.stage(0).num_vars());
  EXPECT_EQ(1, sp.stage(1).num_vars());
  EXPECT_EQ(2, sp.stage(2).num_vars());
  for (int i = 0; i < 3; ++i)
    EXPECT_EQ(0, sp.stage(i).num_cons());
}